

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pcmpgtq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int iVar1;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  iVar1 = 0;
  if ((long)s->_q_ZMMReg[0] < (long)d->_q_ZMMReg[0]) {
    iVar1 = -1;
  }
  *(long *)d = (long)iVar1;
  iVar1 = 0;
  if ((long)s->_q_ZMMReg[1] < (long)d->_q_ZMMReg[1]) {
    iVar1 = -1;
  }
  *(long *)(d->_b_ZMMReg + 8) = (long)iVar1;
  return;
}

Assistant:

static inline int pcmp_elen(CPUX86State *env, int reg, uint32_t ctrl)
{
    int val;

    /* Presence of REX.W is indicated by a bit higher than 7 set */
    if (ctrl >> 8) {
        val = abs1((int64_t)env->regs[reg]);
    } else {
        val = abs1((int32_t)env->regs[reg]);
    }

    if (ctrl & 1) {
        if (val > 8) {
            return 8;
        }
    } else {
        if (val > 16) {
            return 16;
        }
    }
    return val;
}